

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_buffer.c
# Opt level: O2

int bufferConv(mpt_convertable *val,mpt_type_t type,void *ptr)

{
  _mpt_vptr_convertable *p_Var1;
  int iVar2;
  uint8_t *puVar3;
  mpt_metaBuffer *m;
  
  if (type == 0x100) {
    iVar2 = 0x802;
    if (ptr != (void *)0x0) {
LAB_0010a83d:
      *(mpt_convertable **)ptr = val;
      return 0x802;
    }
  }
  else if (type == 0xb) {
    iVar2 = 0x802;
    if (ptr != (void *)0x0) {
      puVar3 = (uint8_t *)val[10]._vptr;
LAB_0010a82f:
      *(uint8_t **)ptr = puVar3;
      return iVar2;
    }
  }
  else if ((type == 0x40) || (type == 0x43)) {
    iVar2 = 0x86;
    if (ptr != (void *)0x0) {
      p_Var1 = val[10]._vptr;
      if (p_Var1 != (_mpt_vptr_convertable *)0x0) {
        *(_mpt_vptr_convertable **)ptr = p_Var1 + 4;
        *(_func_int_mpt_convertable_ptr_mpt_type_t_void_ptr **)((long)ptr + 8) = p_Var1[3].convert;
        return 0x86;
      }
      *(undefined8 *)ptr = 0;
      *(undefined8 *)((long)ptr + 8) = 0;
    }
  }
  else if (type == 0x86) {
    iVar2 = 0x802;
    if (ptr != (void *)0x0) {
      val = val + 1;
      goto LAB_0010a83d;
    }
  }
  else {
    if (type != 0) {
      return -3;
    }
    iVar2 = 0x100;
    if (ptr != (void *)0x0) {
      puVar3 = bufferConv::fmt;
      goto LAB_0010a82f;
    }
  }
  return iVar2;
}

Assistant:

static int bufferConv(MPT_INTERFACE(convertable) *val, MPT_TYPE(type) type, void *ptr)
{
	const MPT_STRUCT(metaBuffer) *m = (void *) val;
	
	if (!type) {
		if (ptr) {
			static const uint8_t fmt[] = {
				MPT_ENUM(TypeIteratorPtr),
				MPT_ENUM(TypeBufferPtr),
				MPT_type_toVector('c'),
				0
			};
			*((const uint8_t **) ptr) = fmt;
		}
		return MPT_ENUM(TypeMetaPtr);
	}
	if (type == MPT_ENUM(TypeMetaPtr)) {
		if (ptr) *((const void **) ptr) = &m->_mt;
		return MPT_ENUM(TypeArray);
	}
	if (type == MPT_ENUM(TypeIteratorPtr)) {
		if (ptr) *((const void **) ptr) = &m->_it;
		return MPT_ENUM(TypeArray);
	}
	if (type == MPT_ENUM(TypeBufferPtr)) {
		if (ptr) *((const void **) ptr) = m->s._a._buf;
		return MPT_ENUM(TypeArray);
	}
	if (type == MPT_type_toVector('c')
	    || type == MPT_ENUM(TypeVector)) {
		struct iovec *vec;
		if ((vec = ptr)) {
			MPT_STRUCT(buffer) *buf;
			if ((buf = m->s._a._buf)) {
				vec->iov_base = buf + 1;
				vec->iov_len = buf->_used;
			} else {
				vec->iov_base = 0;
				vec->iov_len = 0;
			}
		}
		return MPT_ENUM(TypeIteratorPtr);
	}
	return MPT_ERROR(BadType);
}